

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall IteratorTest::coordinateTest<false>(IteratorTest *this)

{
  size_t x;
  unsigned_long uVar1;
  size_t y;
  unsigned_long uVar2;
  allocator_type local_d9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 8;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it,&v,0);
  for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 != 3; uVar1 = uVar1 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,2,&local_d9);
      andres::Iterator<int,false,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,false,std::allocator<unsigned_long>> *)&it,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start);
      if (uVar1 == *c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        local_d9 = (allocator_type)
                   (c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[1] == uVar2);
      }
      else {
        local_d9 = (allocator_type)0x0;
      }
      test((bool *)&local_d9);
      andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 8;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (View<int,_true,_std::allocator<unsigned_long>_> *)&v,0);
  for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 != 3; uVar1 = uVar1 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,2,&local_d9);
      andres::Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start);
      if (uVar1 == *c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        local_d9 = (allocator_type)
                   (c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[1] == uVar2);
      }
      else {
        local_d9 = (allocator_type)0x0;
      }
      test((bool *)&local_d9);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 8;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,&v,0);
  for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 != 3; uVar1 = uVar1 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,2,&local_d9);
      andres::Iterator<int,true,std::allocator<unsigned_long>>::
      coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start);
      if (uVar1 == *c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        local_d9 = (allocator_type)
                   (c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[1] == uVar2);
      }
      else {
        local_d9 = (allocator_type)0x0;
      }
      test((bool *)&local_d9);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void IteratorTest::coordinateTest() {
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 3;
        shape[1] = 8;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it(v, 0);

        for(std::size_t y=0; y<8; ++y) {
            for(std::size_t x=0; x<3; ++x) {
                std::vector<std::size_t> c(2);
                it.coordinate(c.begin());
                test(c[0] == x && c[1] == y);
                ++it;
            }
        }
    }
}